

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::csv::detail::m_columns_filter<char,_std::allocator<char>_>::initialize
          (m_columns_filter<char,_std::allocator<char>_> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *column_names)

{
  pointer *ppvVar1;
  pointer pbVar2;
  iterator __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pointer __x;
  
  __x = (column_names->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (column_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pbVar2) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->column_names_,__x);
      __position._M_current =
           (this->cached_events_).
           super__Vector_base<std::vector<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>,_std::allocator<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>,_std::allocator<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->cached_events_).
          super__Vector_base<std::vector<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>,_std::allocator<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>,_std::allocator<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::vector<jsoncons::csv::detail::parse_event<char,std::allocator<char>>,std::allocator<jsoncons::csv::detail::parse_event<char,std::allocator<char>>>>,std::allocator<std::vector<jsoncons::csv::detail::parse_event<char,std::allocator<char>>,std::allocator<jsoncons::csv::detail::parse_event<char,std::allocator<char>>>>>>
        ::_M_realloc_insert<std::allocator<char>&>
                  ((vector<std::vector<jsoncons::csv::detail::parse_event<char,std::allocator<char>>,std::allocator<jsoncons::csv::detail::parse_event<char,std::allocator<char>>>>,std::allocator<std::vector<jsoncons::csv::detail::parse_event<char,std::allocator<char>>,std::allocator<jsoncons::csv::detail::parse_event<char,std::allocator<char>>>>>>
                    *)&this->cached_events_,__position,(allocator<char> *)&this->field_0x8);
      }
      else {
        ((__position._M_current)->
        super__Vector_base<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>,_std::allocator<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((__position._M_current)->
        super__Vector_base<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>,_std::allocator<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((__position._M_current)->
        super__Vector_base<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>,_std::allocator<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ppvVar1 = &(this->cached_events_).
                   super__Vector_base<std::vector<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>,_std::allocator<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>,_std::allocator<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppvVar1 = *ppvVar1 + 1;
      }
      __x = __x + 1;
    } while (__x != pbVar2);
  }
  this->name_index_ = 0;
  this->level_ = 0;
  this->level2_ = 0;
  this->state_ = begin_object;
  this->column_index_ = 0;
  this->row_index_ = 0;
  return;
}

Assistant:

void initialize(const std::vector<string_type, string_allocator_type>& column_names)
        {
            for (const auto& name : column_names)
            {
                column_names_.push_back(name);
                cached_events_.emplace_back(alloc_);
            }
            name_index_ = 0;
            level_ = 0;
            level2_ = 0;
            column_index_ = 0;
            row_index_ = 0;
            state_ = cached_state::begin_object;
        }